

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_block_hints(CompilerGLSL *this,SPIRBlock *block)

{
  char *pcVar1;
  uint uVar2;
  string local_30;
  
  uVar2 = 0x8b;
  if ((this->options).es != false) {
    uVar2 = 0x135;
  }
  if ((this->options).version <= uVar2) {
    return;
  }
  switch(block->hint) {
  case HintUnroll:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GL_EXT_control_flow_attributes","");
    require_extension_internal(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pcVar1 = "#define SPIRV_CROSS_UNROLL";
    goto LAB_002264fe;
  case HintDontUnroll:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GL_EXT_control_flow_attributes","");
    require_extension_internal(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    statement<char_const(&)[17]>(this,(char (*) [17])0x359a61);
    break;
  case HintFlatten:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GL_EXT_control_flow_attributes","");
    require_extension_internal(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    statement<char_const(&)[20]>(this,(char (*) [20])0x359a0f);
    break;
  case HintDontFlatten:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GL_EXT_control_flow_attributes","");
    require_extension_internal(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pcVar1 = "#define SPIRV_CROSS_BRANCH";
LAB_002264fe:
    statement<char_const(&)[19]>(this,(char (*) [19])(pcVar1 + 8));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_block_hints(const SPIRBlock &block)
{
	if ((options.es && options.version < 310) || (!options.es && options.version < 140))
		return;

	switch (block.hint)
	{
	case SPIRBlock::HintFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_FLATTEN");
		break;
	case SPIRBlock::HintDontFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_BRANCH");
		break;
	case SPIRBlock::HintUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_UNROLL");
		break;
	case SPIRBlock::HintDontUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_LOOP");
		break;
	default:
		break;
	}
}